

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# files.cpp
# Opt level: O2

char * __thiscall FileReader::Gets(FileReader *this,char *strbuf,int len)

{
  long lVar1;
  char *pcVar2;
  long lVar3;
  
  if (((0 < len) && (this->FilePos < this->Length + this->StartPos)) &&
     (pcVar2 = fgets(strbuf,len,(FILE *)this->File), pcVar2 != (char *)0x0)) {
    lVar1 = this->FilePos;
    lVar3 = ftell((FILE *)this->File);
    this->FilePos = lVar3;
    if (lVar3 - this->StartPos <= this->Length) {
      return pcVar2;
    }
    strbuf[this->StartPos + (this->Length - (long)(int)lVar1)] = '\0';
    return pcVar2;
  }
  return (char *)0x0;
}

Assistant:

char *FileReader::Gets(char *strbuf, int len)
{
	if (len <= 0 || FilePos >= StartPos + Length) return NULL;
	char *p = fgets(strbuf, len, File);
	if (p != NULL)
	{
		int old = FilePos;
		FilePos = ftell(File);
		if (FilePos - StartPos > Length)
		{
			strbuf[Length - old + StartPos] = 0;
		}
	}
	return p;
}